

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall
md::Code::lsx(Code *this,uint8_t bitcount,DataRegister *reg,bool direction_left,Size size)

{
  int iVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uchar local_1a;
  uchar local_19;
  
  if (0xf7 < (byte)(bitcount - 9)) {
    uVar4 = 0x40;
    if (size != WORD) {
      uVar4 = (uint)(size == LONG) << 7;
    }
    uVar3 = (uint)bitcount;
    if (bitcount == '\b') {
      uVar3 = 0;
    }
    iVar1 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
    iVar1 = iVar1 + ((uint)direction_left << 8 | uVar3 << 9 | uVar4 | 0xffffe008);
    local_1a = (uchar)((uint)iVar1 >> 8);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_1a);
    local_19 = (uchar)iVar1;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_19);
    return this;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__throw_bad_cast;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Code& Code::lsx(uint8_t bitcount, const DataRegister& reg, bool direction_left, md::Size size)
{
    if(bitcount > 8 || bitcount == 0)
        throw std::exception(); // Impossible

    if(bitcount == 8)
        bitcount = 0;

    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t direction_mask = (direction_left) ? 1 : 0;

    uint16_t opcode = 0xE008 + (bitcount << 9) + (direction_mask << 8) + (size_code << 6) + reg.getXn();
    this->add_opcode(opcode);
    return *this;
}